

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_firstIndexOf_fromIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer psVar1;
  int iVar2;
  bool bVar3;
  pointer psVar4;
  undefined8 *puVar5;
  IntegerInstance *this_00;
  ulong uVar6;
  long lVar7;
  shared_ptr<Instance> *lhs;
  shared_ptr<Instance> instance;
  IntegerInstance local_88;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  get_shared_instance((string *)&instance,&this->_element_type);
  IntegerInstance::IntegerInstance
            (&local_88,
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  iVar2 = local_88._value;
  this_00 = &local_88;
  uVar6 = (ulong)(uint)local_88._value;
  CharacterInstance::~CharacterInstance((CharacterInstance *)this_00);
  if (-1 < iVar2) {
    psVar1 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2 <= (int)((ulong)((long)psVar4 - (long)psVar1) >> 4)) {
      lhs = psVar1 + uVar6;
      lVar7 = -(long)lhs;
      do {
        if (lhs == psVar4) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,"-1",(allocator *)&local_88)
          ;
LAB_00155ea7:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          return __return_storage_ptr__;
        }
        bVar3 = InstanceIsEqualToComparator::operator()
                          ((InstanceIsEqualToComparator *)this_00,lhs,&instance);
        if (bVar3) {
          IntegerInstance::IntegerInstance
                    (&local_88,
                     (int)((ulong)-((long)&(((this->_value).
                                             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)
                                           ._M_ptr + lVar7) >> 4));
          std::__cxx11::to_string(__return_storage_ptr__,local_88._value);
          CharacterInstance::~CharacterInstance((CharacterInstance *)&local_88);
          goto LAB_00155ea7;
        }
        lhs = lhs + 1;
        psVar4 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar7 = lVar7 + -0x10;
      } while( true );
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_firstIndexOf_fromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (auto it = _value.begin() + from_index; it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            return IntegerInstance(it - _value.begin()).representation();
    return "-1";
}